

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  int num_digits_00;
  type tVar3;
  appender *paVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *pbVar5;
  appender aVar6;
  bool bVar7;
  char local_3bb;
  char local_3b9;
  basic_format_specs<char> *specs_local;
  locale_ref loc_local;
  write_int_arg<unsigned_long> arg_local;
  appender out_local;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  undefined4 uStack_304;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint local_2c4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_2c0;
  uint prefix;
  unsigned_long abs_value;
  basic_format_specs<char> *local_2b0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2a8;
  uint local_2a0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_298;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_290;
  anon_class_40_3_03e05ccd local_288;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_260;
  undefined1 local_258 [8];
  write_int_data<char> data;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_230;
  value_type local_225;
  uint local_224;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_220;
  uint p;
  appender it;
  anon_class_16_2_2cc2fad2_for_write_digits local_208;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1f8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1f0;
  anon_class_40_3_03e05ccd_conflict local_1e8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1c0;
  undefined1 local_1b8 [8];
  write_int_data<char> data_1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_190;
  value_type local_185;
  uint local_184;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_180;
  uint p_1;
  appender it_1;
  anon_class_16_3_9e397504_for_write_digits local_168;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_158;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_150;
  anon_class_40_3_03e05ccd local_148;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_120;
  undefined1 local_118 [8];
  write_int_data<char> data_2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_f0;
  value_type local_e5;
  uint local_e4;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_e0;
  uint p_2;
  appender it_2;
  anon_class_16_2_2cc2fad2_for_write_digits local_c8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b0;
  anon_class_40_3_03e05ccd local_a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_80;
  undefined1 local_78 [8];
  write_int_data<char> data_3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_50;
  value_type local_45;
  uint local_44;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bStack_40;
  uint p_3;
  appender it_3;
  anon_class_16_2_2cc2fad2_for_write_digits local_28;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_18;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_10;
  
  abs_value = arg._8_8_;
  local_2c4 = (uint)arg.abs_value;
  bStack_2c0 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_2b0 = specs;
  local_2a8 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_2a0 = local_2c4;
  local_298.container = (buffer<char> *)this;
  switch(((basic_format_specs<char> *)abs_value)->type) {
  case none:
  case dec:
    if (((*(ushort *)&((basic_format_specs<char> *)abs_value)->field_0x9 >> 8 & 1) == 0) ||
       (bVar7 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                          ((appender *)&local_298,
                           (unsigned_long)
                           out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                           local_2c4,(basic_format_specs<char> *)abs_value,(locale_ref)specs),
       !bVar7)) {
      local_208.num_digits = count_digits((uint64_t)bStack_2c0.container);
      uVar1 = local_2c4;
      local_1f8.container = local_298.container;
      local_208.abs_value = (unsigned_long)bStack_2c0.container;
      it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v8::detail::buffer<char>_>)abs_value;
      if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
        tVar3 = to_unsigned<int>(local_208.num_digits);
        paVar4 = reserve<fmt::v8::appender>((appender *)&local_1f8,(ulong)(tVar3 + (uVar1 >> 0x18)))
        ;
        bStack_220.container =
             (paVar4->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
        if (uVar1 != 0) {
          for (local_224 = uVar1 & 0xffffff; local_224 != 0; local_224 = local_224 >> 8) {
            local_225 = (value_type)local_224;
            local_230.container =
                 (buffer<char> *)appender::operator++((appender *)&stack0xfffffffffffffde0,0);
            pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*
                               (&local_230);
            std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar5,&local_225);
          }
        }
        bVar2.container = local_1f8.container;
        data.padding = (size_t)bStack_220.container;
        aVar6 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1579:41)>
                ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                          (&local_208,(reserve_iterator<fmt::v8::appender>)bStack_220.container);
        local_1f0.container =
             (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar6);
      }
      else {
        write_int_data<char>::write_int_data
                  ((write_int_data<char> *)local_258,local_208.num_digits,local_2c4,
                   (basic_format_specs<char> *)abs_value);
        local_260.container = local_1f8.container;
        local_288.prefix = uVar1;
        local_288.data.size = (size_t)local_258;
        local_288.data.padding = data.size;
        local_288.write_digits.abs_value = local_208.abs_value;
        local_288.write_digits.num_digits = local_208.num_digits;
        local_1f0.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                       (local_1f8.container,
                        it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                        (size_t)local_258,&local_288);
      }
      local_290.container = local_1f0.container;
    }
    else {
      local_290.container = local_298.container;
    }
    break;
  case oct:
    local_28.num_digits =
         count_digits<3,unsigned_long>
                   ((unsigned_long)
                    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    if ((((*(ushort *)(abs_value + 9) >> 7 & 1) != 0) &&
        (*(int *)(abs_value + 4) <= local_28.num_digits)) &&
       (bStack_2c0.container != (buffer<char> *)0x0)) {
      prefix_append(&local_2c4,0x30);
    }
    uVar1 = local_2c4;
    local_18.container = local_298.container;
    local_28.abs_value = (unsigned_long)bStack_2c0.container;
    it_3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(local_28.num_digits);
      paVar4 = reserve<fmt::v8::appender>((appender *)&local_18,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_40.container =
           (paVar4->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_44 = uVar1 & 0xffffff; local_44 != 0; local_44 = local_44 >> 8) {
          local_45 = (value_type)local_44;
          local_50.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffc0,0);
          pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_50);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar5,&local_45);
        }
      }
      bVar2.container = local_18.container;
      data_3.padding = (size_t)bStack_40.container;
      aVar6 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1612:22)>
              ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                        (&local_28,(reserve_iterator<fmt::v8::appender>)bStack_40.container);
      local_10.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar6);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_78,local_28.num_digits,local_2c4,
                 (basic_format_specs<char> *)abs_value);
      local_80.container = local_18.container;
      local_a8.prefix = uVar1;
      local_a8.data.size = (size_t)local_78;
      local_a8.data.padding = data_3.size;
      local_a8.write_digits.abs_value = local_28.abs_value;
      local_a8.write_digits.num_digits = local_28.num_digits;
      local_10.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                     (local_18.container,
                      it_3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_78,&local_a8);
    }
    local_290.container = local_10.container;
    break;
  case hex_lower:
  case hex_upper:
    bVar7 = ((basic_format_specs<char> *)abs_value)->type == hex_upper;
    if ((*(ushort *)&((basic_format_specs<char> *)abs_value)->field_0x9 >> 7 & 1) != 0) {
      local_3b9 = 'X';
      if (!bVar7) {
        local_3b9 = 'x';
      }
      prefix_append(&local_2c4,(int)local_3b9 << 8 | 0x30);
    }
    num_digits_00 = count_digits<4,unsigned_long>((unsigned_long)bStack_2c0.container);
    uVar1 = local_2c4;
    uStack_304 = CONCAT31(uStack_304._1_3_,bVar7);
    local_168._12_4_ = uStack_304;
    local_168.num_digits = num_digits_00;
    local_158.container = local_298.container;
    local_168.abs_value = (unsigned_long)bStack_2c0.container;
    it_1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(num_digits_00);
      paVar4 = reserve<fmt::v8::appender>((appender *)&local_158,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_180.container =
           (paVar4->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_184 = uVar1 & 0xffffff; local_184 != 0; local_184 = local_184 >> 8) {
          local_185 = (value_type)local_184;
          local_190.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xfffffffffffffe80,0);
          pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_190);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar5,&local_185);
        }
      }
      bVar2.container = local_158.container;
      data_1.padding = (size_t)bStack_180.container;
      aVar6 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1590:41)>
              ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                        (&local_168,(reserve_iterator<fmt::v8::appender>)bStack_180.container);
      local_150.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar6);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_1b8,num_digits_00,local_2c4,
                 (basic_format_specs<char> *)abs_value);
      local_1c0.container = local_158.container;
      local_1e8.prefix = uVar1;
      local_1e8.data.size = (size_t)local_1b8;
      local_1e8.data.padding = data_1.size;
      local_1e8.write_digits.abs_value = local_168.abs_value;
      local_1e8.write_digits.num_digits = local_168.num_digits;
      local_1e8.write_digits.upper = local_168.upper;
      local_150.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                     (local_158.container,
                      it_1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_1b8,&local_1e8);
    }
    local_290.container = local_150.container;
    break;
  case bin_lower:
  case bin_upper:
    if ((*(ushort *)&((basic_format_specs<char> *)abs_value)->field_0x9 >> 7 & 1) != 0) {
      local_3bb = 'B';
      if (((basic_format_specs<char> *)abs_value)->type != bin_upper) {
        local_3bb = 'b';
      }
      prefix_append(&local_2c4,(int)local_3bb << 8 | 0x30);
    }
    local_c8.num_digits = count_digits<1,unsigned_long>((unsigned_long)bStack_2c0.container);
    uVar1 = local_2c4;
    local_b8.container = local_298.container;
    local_c8.abs_value = (unsigned_long)bStack_2c0.container;
    it_2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)abs_value;
    if (*(int *)abs_value == 0 && *(int *)(abs_value + 4) == -1) {
      tVar3 = to_unsigned<int>(local_c8.num_digits);
      paVar4 = reserve<fmt::v8::appender>((appender *)&local_b8,(ulong)(tVar3 + (uVar1 >> 0x18)));
      bStack_e0.container =
           (paVar4->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      if (uVar1 != 0) {
        for (local_e4 = uVar1 & 0xffffff; local_e4 != 0; local_e4 = local_e4 >> 8) {
          local_e5 = (value_type)local_e4;
          local_f0.container =
               (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffff20,0);
          pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_f0);
          std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(pbVar5,&local_e5);
        }
      }
      bVar2.container = local_b8.container;
      data_2.padding = (size_t)bStack_e0.container;
      aVar6 = write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/fmt-src/include/fmt/format.h:1601:22)>
              ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                        (&local_c8,(reserve_iterator<fmt::v8::appender>)bStack_e0.container);
      local_b0.container = (buffer<char> *)base_iterator<fmt::v8::appender>(bVar2.container,aVar6);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)local_118,local_c8.num_digits,local_2c4,
                 (basic_format_specs<char> *)abs_value);
      local_120.container = local_b8.container;
      local_148.prefix = uVar1;
      local_148.data.size = (size_t)local_118;
      local_148.data.padding = data_2.size;
      local_148.write_digits.abs_value = local_c8.abs_value;
      local_148.write_digits.num_digits = local_c8.num_digits;
      local_b0.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                     (local_b8.container,
                      it_2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                      (size_t)local_118,&local_148);
    }
    local_290.container = local_b0.container;
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_290.container =
         (buffer<char> *)
         write_char<char,fmt::v8::appender>
                   ((appender)this,
                    (char)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                    (basic_format_specs<char> *)abs_value);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_290.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}